

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

uint64_t llvm::hashing::detail::hash_1to3_bytes(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  uint32_t z;
  uint32_t y;
  uint8_t c;
  uint8_t b;
  uint8_t a;
  uint64_t seed_local;
  size_t len_local;
  char *s_local;
  
  uVar1 = shift_mix((ulong)((uint)(byte)*s + (uint)(byte)s[len >> 1] * 0x100) * -0x651e95c4d06fbfb1
                    ^ (ulong)((int)len + (uint)(byte)s[len - 1] * 4) * -0x36b62838af619aa9 ^ seed);
  return uVar1 * -0x651e95c4d06fbfb1;
}

Assistant:

inline uint64_t hash_1to3_bytes(const char *s, size_t len, uint64_t seed) {
  uint8_t a = s[0];
  uint8_t b = s[len >> 1];
  uint8_t c = s[len - 1];
  uint32_t y = static_cast<uint32_t>(a) + (static_cast<uint32_t>(b) << 8);
  uint32_t z = static_cast<uint32_t>(len) + (static_cast<uint32_t>(c) << 2);
  return shift_mix(y * k2 ^ z * k3 ^ seed) * k2;
}